

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satcheck.c
# Opt level: O2

parasail_result_t *
parasail_sg_qe_de_trace_striped_profile_sse2_128_sat
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  parasail_result_t *ppVar2;
  
  ppVar2 = parasail_sg_qe_de_trace_striped_profile_sse2_128_8(profile,s2,s2Len,open,gap);
  iVar1 = parasail_result_is_saturated(ppVar2);
  if (iVar1 != 0) {
    parasail_result_free(ppVar2);
    ppVar2 = parasail_sg_qe_de_trace_striped_profile_sse2_128_16(profile,s2,s2Len,open,gap);
  }
  iVar1 = parasail_result_is_saturated(ppVar2);
  if (iVar1 != 0) {
    parasail_result_free(ppVar2);
    ppVar2 = parasail_sg_qe_de_trace_striped_profile_sse2_128_32(profile,s2,s2Len,open,gap);
    return ppVar2;
  }
  return ppVar2;
}

Assistant:

parasail_result_t* parasail_sg_qe_de_trace_striped_profile_sse2_128_sat(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    parasail_result_t * result = NULL;

    result = parasail_sg_qe_de_trace_striped_profile_sse2_128_8(profile, s2, s2Len, open, gap);
    if (parasail_result_is_saturated(result)) {
        parasail_result_free(result);
        result = parasail_sg_qe_de_trace_striped_profile_sse2_128_16(profile, s2, s2Len, open, gap);
    }
    if (parasail_result_is_saturated(result)) {
        parasail_result_free(result);
        result = parasail_sg_qe_de_trace_striped_profile_sse2_128_32(profile, s2, s2Len, open, gap);
    }

    return result;
}